

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O3

bool google::ParseOperatorName(State *state)

{
  byte bVar1;
  undefined1 uVar2;
  short sVar3;
  undefined1 uVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  undefined8 uVar9;
  bool bVar10;
  long lVar11;
  char *pcVar12;
  char cVar13;
  undefined8 *puVar14;
  undefined4 local_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  
  pcVar12 = state->mangled_cur;
  if ((*pcVar12 == '\0') || (pcVar12[1] == '\0')) {
    return false;
  }
  pcVar5 = state->mangled_cur;
  pcVar6 = state->out_cur;
  pcVar7 = state->out_begin;
  pcVar8 = state->out_end;
  uVar9 = *(undefined8 *)((long)&state->prev_name + 4);
  uStack_38 = (undefined4)((ulong)*(undefined8 *)((long)&state->out_end + 4) >> 0x20);
  local_4c = (undefined4)((ulong)pcVar6 >> 0x20);
  uStack_48 = SUB84(pcVar7,0);
  uStack_44 = (undefined4)((ulong)pcVar7 >> 0x20);
  uStack_40 = SUB84(pcVar8,0);
  uStack_3c = (undefined4)((ulong)pcVar8 >> 0x20);
  sVar3 = state->nest_level;
  uVar2 = state->append;
  uVar4 = state->overflowed;
  if (pcVar12[1] == 'v' && *pcVar12 == 'c') {
    state->mangled_cur = pcVar12 + 2;
    MaybeAppend(state,"operator ");
    state->nest_level = 0;
    bVar10 = ParseType(state);
    if (bVar10) {
      state->nest_level = sVar3;
      return true;
    }
  }
  state->mangled_cur = pcVar5;
  state->out_cur = pcVar6;
  state->out_begin = pcVar7;
  state->out_end = pcVar8;
  *(ulong *)((long)&state->out_cur + 4) = CONCAT44(uStack_48,local_4c);
  *(ulong *)((long)&state->out_begin + 4) = CONCAT44(uStack_40,uStack_44);
  *(ulong *)((long)&state->out_end + 4) = CONCAT44(uStack_38,uStack_3c);
  *(undefined8 *)((long)&state->prev_name + 4) = uVar9;
  state->nest_level = sVar3;
  state->append = (bool)uVar2;
  state->overflowed = (bool)uVar4;
  pcVar12 = state->mangled_cur;
  if (*pcVar12 == 'v') {
    cVar13 = '0';
    lVar11 = 1;
    state->mangled_cur = pcVar12 + 1;
    do {
      if (pcVar12[1] == cVar13) {
        state->mangled_cur = pcVar12 + 2;
        bVar10 = ParseSourceName(state);
        if (bVar10) {
          return true;
        }
        break;
      }
      cVar13 = "0123456789"[lVar11];
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0xb);
  }
  state->mangled_cur = pcVar5;
  state->out_cur = pcVar6;
  state->out_begin = pcVar7;
  state->out_end = pcVar8;
  *(ulong *)((long)&state->out_cur + 4) = CONCAT44(uStack_48,local_4c);
  *(ulong *)((long)&state->out_begin + 4) = CONCAT44(uStack_40,uStack_44);
  *(ulong *)((long)&state->out_end + 4) = CONCAT44(uStack_38,uStack_3c);
  *(undefined8 *)((long)&state->prev_name + 4) = uVar9;
  state->nest_level = sVar3;
  state->append = (bool)uVar2;
  state->overflowed = (bool)uVar4;
  cVar13 = *state->mangled_cur;
  if (((byte)(cVar13 + 0x9fU) < 0x1a) &&
     (bVar1 = state->mangled_cur[1], (byte)((bVar1 & 0xdf) + 0xbf) < 0x1a)) {
    pcVar12 = "nw";
    puVar14 = (undefined8 *)(kOperatorList + 0x10);
    do {
      if ((cVar13 == *pcVar12) && (bVar1 == pcVar12[1])) {
        MaybeAppend(state,"operator");
        pcVar12 = (char *)puVar14[-1];
        if ((byte)(*pcVar12 + 0x9fU) < 0x1a) {
          MaybeAppend(state," ");
        }
        MaybeAppend(state,pcVar12);
        state->mangled_cur = state->mangled_cur + 2;
        return true;
      }
      pcVar12 = (char *)*puVar14;
      puVar14 = puVar14 + 2;
    } while (pcVar12 != (char *)0x0);
  }
  return false;
}

Assistant:

static bool ParseOperatorName(State *state) {
  if (!AtLeastNumCharsRemaining(state->mangled_cur, 2)) {
    return false;
  }
  // First check with "cv" (cast) case.
  State copy = *state;
  if (ParseTwoCharToken(state, "cv") &&
      MaybeAppend(state, "operator ") &&
      EnterNestedName(state) &&
      ParseType(state) &&
      LeaveNestedName(state, copy.nest_level)) {
    return true;
  }
  *state = copy;

  // Then vendor extended operators.
  if (ParseOneCharToken(state, 'v') && ParseCharClass(state, "0123456789") &&
      ParseSourceName(state)) {
    return true;
  }
  *state = copy;

  // Other operator names should start with a lower alphabet followed
  // by a lower/upper alphabet.
  if (!(IsLower(state->mangled_cur[0]) &&
        IsAlpha(state->mangled_cur[1]))) {
    return false;
  }
  // We may want to perform a binary search if we really need speed.
  const AbbrevPair *p;
  for (p = kOperatorList; p->abbrev != NULL; ++p) {
    if (state->mangled_cur[0] == p->abbrev[0] &&
        state->mangled_cur[1] == p->abbrev[1]) {
      MaybeAppend(state, "operator");
      if (IsLower(*p->real_name)) {  // new, delete, etc.
        MaybeAppend(state, " ");
      }
      MaybeAppend(state, p->real_name);
      state->mangled_cur += 2;
      return true;
    }
  }
  return false;
}